

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.cpp
# Opt level: O3

int __thiscall
Al::internal::ProgressEngine::bind(ProgressEngine *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  hwloc_topology_t phVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  hwloc_cpuset_t phVar6;
  long lVar7;
  MPICommunicator *pMVar8;
  ostream *poVar9;
  undefined8 uVar10;
  undefined4 in_register_00000034;
  char *pcVar11;
  int iVar12;
  hwloc_topology_t topo;
  hwloc_cpuset_t cpuset;
  hwloc_topology_t local_40;
  hwloc_cpuset_t local_38;
  
  if (this->core_to_bind < 0) {
    pMVar8 = mpi::get_world_comm();
    poVar9 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cerr,
                        (pMVar8->super_MPICommAndStreamWrapper<int>).rank_in_comm);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,": progress engine binding not initialized",0x29);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    iVar5 = std::ostream::flush();
    return iVar5;
  }
  hwloc_topology_init(&local_40,CONCAT44(in_register_00000034,__fd));
  hwloc_topology_load(local_40);
  phVar6 = (hwloc_cpuset_t)hwloc_bitmap_alloc();
  local_38 = phVar6;
  bVar2 = anon_unknown_5::get_hwloc_cpuset(&local_38,&local_40);
  phVar1 = local_40;
  if (bVar2) {
    iVar5 = this->core_to_bind;
    uVar3 = hwloc_get_type_depth(local_40,2);
    if (uVar3 < 0xfffffffe) {
      iVar12 = 0;
      for (lVar7 = hwloc_get_obj_by_depth(phVar1,uVar3,0); lVar7 != 0;
          lVar7 = *(long *)(lVar7 + 0x38)) {
        uVar10 = *(undefined8 *)(lVar7 + 0xb8);
        iVar4 = hwloc_bitmap_iszero(uVar10);
        if ((iVar4 == 0) && (iVar4 = hwloc_bitmap_isincluded(uVar10,phVar6), iVar4 != 0)) {
          if (iVar12 == iVar5) {
            uVar10 = hwloc_bitmap_dup(uVar10);
            hwloc_bitmap_singlify(uVar10);
            iVar5 = hwloc_set_cpubind(local_40,uVar10,2);
            if (iVar5 == -1) {
              pMVar8 = mpi::get_world_comm();
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 ((ostream *)&std::cerr,
                                  (pMVar8->super_MPICommAndStreamWrapper<int>).rank_in_comm);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,": failed to bind progress thread",0x20);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
            }
            hwloc_bitmap_free(uVar10);
            goto LAB_0010b82d;
          }
          iVar12 = iVar12 + 1;
        }
      }
    }
    pMVar8 = mpi::get_world_comm();
    poVar9 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cerr,
                        (pMVar8->super_MPICommAndStreamWrapper<int>).rank_in_comm);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": could not get core ",0x15);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,this->core_to_bind);
    pcVar11 = "; not binding progress thread";
    lVar7 = 0x1d;
  }
  else {
    pMVar8 = mpi::get_world_comm();
    poVar9 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cerr,
                        (pMVar8->super_MPICommAndStreamWrapper<int>).rank_in_comm);
    pcVar11 = ": Could not get starting cpuset; not binding progress thread";
    lVar7 = 0x3c;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar11,lVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
LAB_0010b82d:
  hwloc_bitmap_free(phVar6);
  iVar5 = hwloc_topology_destroy(local_40);
  return iVar5;
}

Assistant:

void ProgressEngine::bind() {
  if (core_to_bind < 0) {
    std::cerr << mpi::get_world_comm().rank()
              << ": progress engine binding not initialized"
              << std::endl;
    return;
  }

  hwloc_topology_t topo;
  hwloc_topology_init(&topo);
  hwloc_topology_load(topo);
  hwloc_cpuset_t cpuset = hwloc_bitmap_alloc();
  if (!get_hwloc_cpuset(cpuset, topo)) {
    std::cerr << mpi::get_world_comm().rank()
              << ": Could not get starting cpuset; not binding progress thread"
              << std::endl;
    hwloc_bitmap_free(cpuset);
    hwloc_topology_destroy(topo);
    return;
  }

  hwloc_obj_t core = hwloc_get_obj_inside_cpuset_by_type(
    topo, cpuset, HWLOC_OBJ_CORE, core_to_bind);
  if (core == NULL) {
    std::cerr << mpi::get_world_comm().rank()
              << ": could not get core "
              << core_to_bind
              << "; not binding progress thread"
              << std::endl;
    hwloc_bitmap_free(cpuset);
    hwloc_topology_destroy(topo);
    return;
  }
  hwloc_cpuset_t coreset = hwloc_bitmap_dup(core->cpuset);
  hwloc_bitmap_singlify(coreset);
  if (hwloc_set_cpubind(topo, coreset, HWLOC_CPUBIND_THREAD) == -1) {
    std::cerr << mpi::get_world_comm().rank()
              << ": failed to bind progress thread"
              << std::endl;
  }

  hwloc_bitmap_free(coreset);
  hwloc_bitmap_free(cpuset);
  hwloc_topology_destroy(topo);
}